

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O1

void Abc_SclAddWireLoad(SC_Man *p,Abc_Obj_t *pObj,int fSubtr)

{
  uint uVar1;
  SC_Pair *pSVar2;
  float fVar3;
  
  fVar3 = Abc_SclFindWireLoad(p->vWireCaps,(pObj->vFanouts).nSize);
  if (fSubtr != 0) {
    fVar3 = -fVar3;
  }
  pSVar2 = p->pLoads;
  uVar1 = pObj->Id;
  pSVar2[uVar1].rise = pSVar2[uVar1].rise + fVar3;
  pSVar2[uVar1].fall = fVar3 + pSVar2[uVar1].fall;
  return;
}

Assistant:

void Abc_SclAddWireLoad( SC_Man * p, Abc_Obj_t * pObj, int fSubtr )
{
    float Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_SclObjLoad(p, pObj)->rise += fSubtr ? -Load : Load;
    Abc_SclObjLoad(p, pObj)->fall += fSubtr ? -Load : Load;
}